

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::clear
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this)

{
  allocator_type *__a;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RDI;
  pointer p;
  
  for (__a = (allocator_type *)in_RDI->m_begin; __a != (allocator_type *)in_RDI->m_end;
      __a = __a + 8) {
    get_alloc(in_RDI);
    Catch::clara::std::allocator_traits<std::allocator<long>_>::destroy<long>(__a,(long *)in_RDI);
  }
  in_RDI->m_end = in_RDI->m_begin;
  return;
}

Assistant:

void clear() noexcept
    {
        for (auto p = m_begin; p != m_end; ++p)
        {
            atraits::destroy(get_alloc(), p);
        }

        if (RevertToStaticSize > 0)
        {
            m_begin = m_end = static_begin_ptr();
            m_capacity = StaticCapacity;
        }
        else
        {
            m_end = m_begin;
        }
    }